

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrefcnt.cpp
# Opt level: O1

void __thiscall CVmWeakRefable::CVmWeakRefable(CVmWeakRefable *this)

{
  OS_Mutex *pOVar1;
  
  (this->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (this->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__CVmWeakRefable_0032d5e8;
  this->weakref = (CVmWeakRef *)0x0;
  pOVar1 = (OS_Mutex *)operator_new(0x38);
  (pOVar1->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (pOVar1->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__OS_Mutex_0032d638;
  pthread_mutex_init((pthread_mutex_t *)&pOVar1->h,(pthread_mutexattr_t *)0x0);
  this->mu = pOVar1;
  return;
}

Assistant:

CVmWeakRefable::CVmWeakRefable()
{
    /* we don't have a weak ref yet */
    weakref = 0;

    /* create our mutex */
    mu = new OS_Mutex();
}